

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_read_file(mbedtls_mpi *X,int radix,FILE *fin)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_a00;
  char local_9f8 [8];
  char s [2484];
  char *p;
  size_t slen;
  mbedtls_mpi_uint d;
  FILE *fin_local;
  mbedtls_mpi *pmStack_18;
  int radix_local;
  mbedtls_mpi *X_local;
  
  uStack_a00 = 0x109b39;
  d = (mbedtls_mpi_uint)fin;
  fin_local._4_4_ = radix;
  pmStack_18 = X;
  memset(local_9f8,0,0x9b4);
  uStack_a00 = 0x109b4e;
  pcVar2 = fgets(local_9f8,0x9b3,(FILE *)d);
  if (pcVar2 == (char *)0x0) {
    X_local._4_4_ = -2;
  }
  else {
    uStack_a00 = 0x109b6c;
    p = (char *)strlen(local_9f8);
    if (p == (char *)0x9b2) {
      X_local._4_4_ = -8;
    }
    else {
      if ((p + -0x9f9)[(long)&stack0x00000000] == '\n') {
        p = p + -1;
        local_9f8[(long)p] = '\0';
      }
      if ((p + -0x9f9)[(long)&stack0x00000000] == '\r') {
        p = p + -1;
        local_9f8[(long)p] = '\0';
      }
      register0x00000000 = local_9f8 + (long)p;
      do {
        register0x00000000 = stack0xffffffffffffffc0 + -1;
        if (register0x00000000 < local_9f8) break;
        uStack_a00 = 0x109c1a;
        iVar1 = mpi_get_digit(&slen,fin_local._4_4_,*register0x00000000);
      } while (iVar1 == 0);
      uStack_a00 = 0x109c37;
      X_local._4_4_ =
           mbedtls_mpi_read_string(pmStack_18,fin_local._4_4_,stack0xffffffffffffffc0 + 1);
    }
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_read_file( mbedtls_mpi *X, int radix, FILE *fin )
{
    mbedtls_mpi_uint d;
    size_t slen;
    char *p;
    /*
     * Buffer should have space for (short) label and decimal formatted MPI,
     * newline characters and '\0'
     */
    char s[ MBEDTLS_MPI_RW_BUFFER_SIZE ];

    memset( s, 0, sizeof( s ) );
    if( fgets( s, sizeof( s ) - 1, fin ) == NULL )
        return( MBEDTLS_ERR_MPI_FILE_IO_ERROR );

    slen = strlen( s );
    if( slen == sizeof( s ) - 2 )
        return( MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL );

    if( s[slen - 1] == '\n' ) { slen--; s[slen] = '\0'; }
    if( s[slen - 1] == '\r' ) { slen--; s[slen] = '\0'; }

    p = s + slen;
    while( --p >= s )
        if( mpi_get_digit( &d, radix, *p ) != 0 )
            break;

    return( mbedtls_mpi_read_string( X, radix, p + 1 ) );
}